

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmake.cxx
# Opt level: O1

void __thiscall cmake::IssueMessage(cmake *this,MessageType t,string *text,cmListFileContext *lfc)

{
  bool bVar1;
  char *pcVar2;
  ostringstream msg;
  undefined1 local_1a0 [376];
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a0);
  bVar1 = PrintMessagePreamble(this,t,(ostream *)local_1a0);
  if (bVar1) {
    pcVar2 = " at ";
    if (lfc->Line == 0) {
      pcVar2 = " in ";
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a0,pcVar2,4);
    operator<<((ostream *)local_1a0,lfc);
    printMessageText((ostream *)local_1a0,text);
    displayMessage(t,(ostringstream *)local_1a0);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a0);
  std::ios_base::~ios_base((ios_base *)(local_1a0 + 0x70));
  return;
}

Assistant:

void cmake::IssueMessage(cmake::MessageType t, std::string const& text,
                         cmListFileContext const& lfc)
{
  std::ostringstream msg;
  if (!this->PrintMessagePreamble(t, msg))
    {
    return;
    }

  // Add the immediate context.
  msg << (lfc.Line ? " at " : " in ") << lfc;

  printMessageText(msg, text);

  displayMessage(t, msg);
}